

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * getLinkedTargetsContent<cmLinkImplItem>
                   (string *__return_storage_ptr__,
                   vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *libraries,
                   cmGeneratorTarget *target,cmGeneratorTarget *headTarget,
                   cmGeneratorExpressionContext *context,cmGeneratorExpressionDAGChecker *dagChecker
                   ,string *interfacePropertyName)

{
  cmGeneratorTarget *pcVar1;
  string *psVar2;
  long *plVar3;
  cmLocalGenerator *lg;
  long *plVar4;
  size_type *psVar5;
  pointer pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string sep;
  string depString;
  string local_148;
  long *local_128 [2];
  long local_118 [2];
  string *local_108;
  undefined1 *local_100;
  char *local_f8;
  undefined1 local_f0;
  undefined7 uStack_ef;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  cmGeneratorExpressionDAGChecker *local_58;
  cmGeneratorExpressionContext *local_50;
  cmGeneratorTarget *local_48;
  cmGeneratorTarget *local_40;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *local_38;
  
  local_60 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_100 = &local_f0;
  local_f8 = (char *)0x0;
  local_f0 = 0;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  pcVar6 = (libraries->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_108 = __return_storage_ptr__;
  local_58 = dagChecker;
  local_50 = context;
  local_48 = headTarget;
  if (pcVar6 != (libraries->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>).
                _M_impl.super__Vector_impl_data._M_finish) {
    local_40 = target;
    local_38 = libraries;
    do {
      pcVar1 = (pcVar6->super_cmLinkItem).Target;
      if (pcVar1 != target && pcVar1 != (cmGeneratorTarget *)0x0) {
        local_128[0] = local_118;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_128,local_100,local_f8 + (long)local_100);
        std::__cxx11::string::append((char *)local_128);
        psVar2 = cmGeneratorTarget::GetName_abi_cxx11_((pcVar6->super_cmLinkItem).Target);
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_128,(ulong)(psVar2->_M_dataplus)._M_p);
        plVar4 = plVar3 + 2;
        if ((long *)*plVar3 == plVar4) {
          local_d0 = *plVar4;
          lStack_c8 = plVar3[3];
          local_e0 = &local_d0;
        }
        else {
          local_d0 = *plVar4;
          local_e0 = (long *)*plVar3;
        }
        local_d8 = plVar3[1];
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_e0);
        plVar4 = plVar3 + 2;
        if ((long *)*plVar3 == plVar4) {
          local_b0 = *plVar4;
          lStack_a8 = plVar3[3];
          local_c0 = &local_b0;
        }
        else {
          local_b0 = *plVar4;
          local_c0 = (long *)*plVar3;
        }
        local_b8 = plVar3[1];
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_c0,
                                    (ulong)(interfacePropertyName->_M_dataplus)._M_p);
        plVar4 = plVar3 + 2;
        if ((long *)*plVar3 == plVar4) {
          local_90 = *plVar4;
          lStack_88 = plVar3[3];
          local_a0 = &local_90;
        }
        else {
          local_90 = *plVar4;
          local_a0 = (long *)*plVar3;
        }
        local_98 = plVar3[1];
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_a0);
        psVar5 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_148.field_2._M_allocated_capacity = *psVar5;
          local_148.field_2._8_8_ = plVar3[3];
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        }
        else {
          local_148.field_2._M_allocated_capacity = *psVar5;
          local_148._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_148._M_string_length = plVar3[1];
        *plVar3 = (long)psVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_148._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if (local_a0 != &local_90) {
          operator_delete(local_a0,local_90 + 1);
        }
        if (local_c0 != &local_b0) {
          operator_delete(local_c0,local_b0 + 1);
        }
        if (local_e0 != &local_d0) {
          operator_delete(local_e0,local_d0 + 1);
        }
        if (local_128[0] != local_118) {
          operator_delete(local_128[0],local_118[0] + 1);
        }
        std::__cxx11::string::_M_replace((ulong)&local_100,0,local_f8,0x554ed2);
        target = local_40;
        libraries = local_38;
      }
      pcVar6 = pcVar6 + 1;
    } while (pcVar6 != (libraries->
                       super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  psVar2 = local_108;
  if (local_80._M_string_length != 0) {
    lg = cmGeneratorTarget::GetLocalGenerator(target);
    cmGeneratorExpressionNode::EvaluateDependentExpression
              (&local_148,&local_80,lg,local_50,local_48,target,local_58);
    std::__cxx11::string::operator=((string *)psVar2,(string *)&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
  }
  cmGeneratorExpression::StripEmptyListElements(&local_148,psVar2);
  std::__cxx11::string::operator=((string *)psVar2,(string *)&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,CONCAT71(uStack_ef,local_f0) + 1);
  }
  return psVar2;
}

Assistant:

std::string getLinkedTargetsContent(
  std::vector<T> const& libraries, cmGeneratorTarget const* target,
  cmGeneratorTarget const* headTarget, cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagChecker,
  const std::string& interfacePropertyName)
{
  std::string linkedTargetsContent;
  std::string sep;
  std::string depString;
  for (typename std::vector<T>::const_iterator it = libraries.begin();
       it != libraries.end(); ++it) {
    // Broken code can have a target in its own link interface.
    // Don't follow such link interface entries so as not to create a
    // self-referencing loop.
    if (it->Target && it->Target != target) {
      depString += sep + "$<TARGET_PROPERTY:" + it->Target->GetName() + "," +
        interfacePropertyName + ">";
      sep = ";";
    }
  }
  if (!depString.empty()) {
    linkedTargetsContent =
      cmGeneratorExpressionNode::EvaluateDependentExpression(
        depString, target->GetLocalGenerator(), context, headTarget, target,
        dagChecker);
  }
  linkedTargetsContent =
    cmGeneratorExpression::StripEmptyListElements(linkedTargetsContent);
  return linkedTargetsContent;
}